

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O0

void rr::anon_unknown_1::readUint2101010Rev<float>(Vector<float,_4> *dst,int size,void *ptr)

{
  uint uVar1;
  float *pfVar2;
  uint local_24;
  void *pvStack_20;
  deUint32 aligned;
  void *ptr_local;
  Vector<float,_4> *pVStack_10;
  int size_local;
  Vector<float,_4> *dst_local;
  
  pvStack_20 = ptr;
  ptr_local._4_4_ = size;
  pVStack_10 = dst;
  ::deMemcpy(&local_24,ptr,4);
  uVar1 = local_24 & 0x3ff;
  pfVar2 = tcu::Vector<float,_4>::operator[](pVStack_10,0);
  *pfVar2 = (float)uVar1;
  if (1 < ptr_local._4_4_) {
    uVar1 = local_24 >> 10;
    pfVar2 = tcu::Vector<float,_4>::operator[](pVStack_10,1);
    *pfVar2 = (float)(uVar1 & 0x3ff);
  }
  if (2 < ptr_local._4_4_) {
    uVar1 = local_24 >> 0x14;
    pfVar2 = tcu::Vector<float,_4>::operator[](pVStack_10,2);
    *pfVar2 = (float)(uVar1 & 0x3ff);
  }
  if (3 < ptr_local._4_4_) {
    pfVar2 = tcu::Vector<float,_4>::operator[](pVStack_10,3);
    *pfVar2 = (float)(local_24 >> 0x1e);
  }
  return;
}

Assistant:

inline void readUint2101010Rev (typename tcu::Vector<DstScalarType, 4>& dst, const int size, const void* ptr)
{
	deUint32 aligned;
	deMemcpy(&aligned, ptr, sizeof(deUint32));

				   dst[0] = DstScalarType((aligned >>  0) & ((1 << 10) - 1));
	if (size >= 2) dst[1] = DstScalarType((aligned >> 10) & ((1 << 10) - 1));
	if (size >= 3) dst[2] = DstScalarType((aligned >> 20) & ((1 << 10) - 1));
	if (size >= 4) dst[3] = DstScalarType((aligned >> 30) & ((1 <<  2) - 1));
}